

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_astIfNode_primitiveAnalyze
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  _Bool _Var1;
  _Bool _Var2;
  sysbvm_tuple_t *psVar3;
  sysbvm_tuple_t sVar4;
  sysbvm_tuple_t type;
  sysbvm_tuple_t type_00;
  sysbvm_tuple_t local_c0;
  undefined1 auStack_b0 [3];
  _Bool falseExpressionIsUndefinedType;
  _Bool falseExpressionIsControlFlowEscape;
  _Bool trueExpressionIsUndefinedType;
  _Bool trueExpressionIsControlFlowEscape;
  _Bool conditionValue;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_stackFrameGCRootsRecord_t gcFrameRecord;
  anon_struct_56_7_8f908ccc gcFrame;
  sysbvm_tuple_t *environment;
  sysbvm_tuple_t *node;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  psVar3 = arguments + 1;
  memset(&gcFrameRecord.roots,0,0x38);
  memset(&sourcePositionRecord.sourcePosition,0,0x20);
  gcFrameRecord.previous._0_4_ = 0;
  gcFrameRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_LANDING_PAD;
  gcFrameRecord._12_4_ = 0;
  gcFrameRecord.rootCount = (size_t)&gcFrameRecord.roots;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
  gcFrameRecord.roots = (sysbvm_tuple_t *)sysbvm_context_shallowCopy(context,*arguments);
  sVar4 = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context,*psVar3);
  gcFrameRecord.roots[3] = sVar4;
  _auStack_b0 = (sysbvm_stackFrameRecord_s *)0x0;
  sourcePositionRecord.previous._0_4_ = 6;
  sourcePositionRecord._8_8_ = gcFrameRecord.roots[2];
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)auStack_b0);
  sVar4 = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                    (context,gcFrameRecord.roots[5],(context->roots).booleanType,*psVar3);
  gcFrameRecord.roots[5] = sVar4;
  if (gcFrameRecord.roots[6] != 0) {
    gcFrame.analyzedCondition =
         sysbvm_interpreter_analyzeASTWithCurrentExpectedTypeWithEnvironment
                   (context,gcFrameRecord.roots[6],*psVar3);
    gcFrameRecord.roots[6] = gcFrame.analyzedCondition;
  }
  if (gcFrameRecord.roots[7] != 0) {
    gcFrame.analyzedTrueExpressionType =
         sysbvm_interpreter_analyzeASTWithCurrentExpectedTypeWithEnvironment
                   (context,gcFrameRecord.roots[7],*psVar3);
    gcFrameRecord.roots[7] = gcFrame.analyzedTrueExpressionType;
  }
  _Var1 = sysbvm_astNode_isLiteralNode(context,gcFrameRecord.roots[5]);
  if (_Var1) {
    sVar4 = sysbvm_astLiteralNode_getValue(gcFrameRecord.roots[5]);
    _Var1 = sysbvm_tuple_boolean_decode(sVar4);
    if (_Var1) {
      local_c0 = gcFrameRecord.roots[6];
    }
    else {
      local_c0 = gcFrameRecord.roots[7];
    }
    gcFrame.analyzedFalseExpressionType = local_c0;
    if (local_c0 == 0) {
      gcFrame.analyzedFalseExpressionType =
           sysbvm_astLiteralNode_create(context,gcFrameRecord.roots[2],0x2f);
    }
    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)auStack_b0);
    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
    context_local = (sysbvm_context_t *)gcFrame.analyzedFalseExpressionType;
  }
  else {
    gcFrameRecord.roots[4] = (context->roots).anyValueType;
    if ((gcFrame.analyzedCondition == 0) || (gcFrame.analyzedTrueExpressionType == 0)) {
      if ((gcFrameRecord.roots[6] == 0) || (gcFrameRecord.roots[7] == 0)) {
        gcFrameRecord.roots[4] = (context->roots).voidType;
      }
    }
    else {
      type = sysbvm_astNode_getAnalyzedType(gcFrame.analyzedCondition);
      type_00 = sysbvm_astNode_getAnalyzedType(gcFrame.analyzedTrueExpressionType);
      _Var1 = sysbvm_type_isDirectSubtypeOf(type,(context->roots).controlFlowEscapeType);
      sVar4 = (context->roots).undefinedObjectType;
      _Var2 = sysbvm_type_isDirectSubtypeOf(type_00,(context->roots).controlFlowEscapeType);
      if ((_Var1) || (type == sVar4)) {
        gcFrameRecord.roots[4] = type_00;
      }
      else if ((_Var2) || (type_00 == (context->roots).undefinedObjectType)) {
        gcFrameRecord.roots[4] = type;
      }
      else {
        sVar4 = sysbvm_type_computeLCA(type,type_00);
        gcFrameRecord.roots[4] = sVar4;
        if (gcFrameRecord.roots[4] == 0) {
          gcFrameRecord.roots[4] = (context->roots).anyValueType;
        }
      }
    }
    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)auStack_b0);
    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
    context_local = (sysbvm_context_t *)gcFrameRecord.roots;
  }
  return (sysbvm_tuple_t)context_local;
}

Assistant:

static sysbvm_tuple_t sysbvm_astIfNode_primitiveAnalyze(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    struct {
        sysbvm_astIfNode_t *ifNode;
        sysbvm_tuple_t analyzedCondition;
        sysbvm_tuple_t analyzedTrueExpression;
        sysbvm_tuple_t analyzedTrueExpressionType;
        sysbvm_tuple_t analyzedFalseExpression;
        sysbvm_tuple_t analyzedFalseExpressionType;

        sysbvm_tuple_t analyzedTakenBranch;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    gcFrame.ifNode = (sysbvm_astIfNode_t*)sysbvm_context_shallowCopy(context, *node);
    gcFrame.ifNode->super.analyzerToken = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context, *environment);
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, gcFrame.ifNode->super.sourcePosition);

    gcFrame.analyzedCondition = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment(context, gcFrame.ifNode->conditionExpression, context->roots.booleanType, *environment);
    gcFrame.ifNode->conditionExpression = gcFrame.analyzedCondition;
    if(gcFrame.ifNode->trueExpression)
    {
        gcFrame.analyzedTrueExpression = sysbvm_interpreter_analyzeASTWithCurrentExpectedTypeWithEnvironment(context, gcFrame.ifNode->trueExpression, *environment);
        gcFrame.ifNode->trueExpression = gcFrame.analyzedTrueExpression;
    }
    if(gcFrame.ifNode->falseExpression)
    {
        gcFrame.analyzedFalseExpression = sysbvm_interpreter_analyzeASTWithCurrentExpectedTypeWithEnvironment(context, gcFrame.ifNode->falseExpression, *environment);
        gcFrame.ifNode->falseExpression = gcFrame.analyzedFalseExpression;
    }

    if(sysbvm_astNode_isLiteralNode(context, gcFrame.ifNode->conditionExpression))
    {
        bool conditionValue = sysbvm_tuple_boolean_decode(sysbvm_astLiteralNode_getValue(gcFrame.ifNode->conditionExpression));
        gcFrame.analyzedTakenBranch = conditionValue ? gcFrame.ifNode->trueExpression : gcFrame.ifNode->falseExpression;
        if(!gcFrame.analyzedTakenBranch)
            gcFrame.analyzedTakenBranch = sysbvm_astLiteralNode_create(context, gcFrame.ifNode->super.sourcePosition, SYSBVM_VOID_TUPLE);
        
        SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
        return gcFrame.analyzedTakenBranch;
    }

    // Require the same, otherwise fallback to void.
    gcFrame.ifNode->super.analyzedType = context->roots.anyValueType;
    if(gcFrame.analyzedTrueExpression && gcFrame.analyzedFalseExpression)
    {
        gcFrame.analyzedTrueExpressionType = sysbvm_astNode_getAnalyzedType(gcFrame.analyzedTrueExpression);
        gcFrame.analyzedFalseExpressionType = sysbvm_astNode_getAnalyzedType(gcFrame.analyzedFalseExpression);
        bool trueExpressionIsControlFlowEscape = sysbvm_type_isDirectSubtypeOf(gcFrame.analyzedTrueExpressionType, context->roots.controlFlowEscapeType);
        bool trueExpressionIsUndefinedType = gcFrame.analyzedTrueExpressionType == context->roots.undefinedObjectType;

        bool falseExpressionIsControlFlowEscape = sysbvm_type_isDirectSubtypeOf(gcFrame.analyzedFalseExpressionType, context->roots.controlFlowEscapeType);
        bool falseExpressionIsUndefinedType = gcFrame.analyzedFalseExpressionType == context->roots.undefinedObjectType;

        if(trueExpressionIsControlFlowEscape || trueExpressionIsUndefinedType)
        {
            gcFrame.ifNode->super.analyzedType = gcFrame.analyzedFalseExpressionType;
        }
        else if(falseExpressionIsControlFlowEscape || falseExpressionIsUndefinedType)
        {
            gcFrame.ifNode->super.analyzedType = gcFrame.analyzedTrueExpressionType;
        }
        else
        {
            gcFrame.ifNode->super.analyzedType = sysbvm_type_computeLCA(gcFrame.analyzedTrueExpressionType, gcFrame.analyzedFalseExpressionType);
            if(!gcFrame.ifNode->super.analyzedType)
                gcFrame.ifNode->super.analyzedType = context->roots.anyValueType;
        }
    }
    else if(!gcFrame.ifNode->trueExpression || !gcFrame.ifNode->falseExpression)
    {
        gcFrame.ifNode->super.analyzedType = context->roots.voidType;
    }

    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return (sysbvm_tuple_t)gcFrame.ifNode;
}